

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_fwd_aload(jit_State *J)

{
  IRIns *pIVar1;
  ushort uVar2;
  TRef TVar3;
  ushort uVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  ushort uVar8;
  long lVar9;
  long lVar10;
  
  TVar3 = fwd_ahload(J,(uint)(J->fold).ins.field_0.op1);
  if (TVar3 != 0) {
    return TVar3;
  }
  pIVar1 = (J->cur).ir;
  uVar5 = (ulong)(J->fold).ins.field_0.op1;
  uVar7 = (ulong)*(ushort *)((long)pIVar1 + uVar5 * 8 + 2);
  if ((((*(char *)((long)pIVar1 + uVar7 * 8 + 5) == ')') &&
       (lVar9 = (long)*(short *)((long)pIVar1 + uVar7 * 8 + 2), -1 < lVar9)) &&
      (uVar7 = (ulong)pIVar1[uVar7].field_0.op1, *(char *)((long)pIVar1 + uVar7 * 8 + 5) == ')')) &&
     ((lVar10 = (long)*(short *)((long)pIVar1 + uVar7 * 8 + 2), -1 < lVar10 &&
      (pIVar1[lVar9].field_1.op12 + pIVar1[lVar10].field_1.op12 == 0)))) {
    uVar4 = (ushort)pIVar1[uVar5].field_1.op12;
    uVar6 = (ushort)pIVar1[uVar7].field_1.op12;
    uVar2 = uVar6;
    if (uVar6 < uVar4) {
      uVar2 = uVar4;
    }
    uVar8 = J->chain[0x38];
    while (uVar2 < uVar8) {
      uVar5 = (ulong)uVar8;
      if ((pIVar1[uVar5].field_0.op1 == uVar4) &&
         (*(ushort *)((long)pIVar1 + uVar5 * 8 + 2) == uVar6)) {
        TVar3 = fwd_ahload(J,(uint)uVar8);
        if (TVar3 != 0) {
          return TVar3;
        }
        break;
      }
      uVar8 = *(ushort *)((long)pIVar1 + uVar5 * 8 + 6);
    }
  }
  TVar3 = lj_ir_emit(J);
  return TVar3;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_aload(jit_State *J)
{
  IRRef ref;
  if ((ref = fwd_ahload(J, fins->op1)) ||
      (ref = fwd_aload_reassoc(J)))
    return ref;
  return EMITFOLD;
}